

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Clasp::AspParser::SmAdapter::add(SmAdapter *this,Atom_t id,StringSpan *name,bool output)

{
  __hashtable *__h;
  _Hashtable<Clasp::ConstString,std::pair<Clasp::ConstString_const,unsigned_int>,std::allocator<std::pair<Clasp::ConstString_const,unsigned_int>>,std::__detail::_Select1st,Clasp::StrEq,Clasp::StrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  ConstString n;
  ConstString CStack_38;
  ConstString local_30;
  Atom_t local_28;
  
  ConstString::ConstString(&CStack_38,name);
  p_Var1 = (_Hashtable<Clasp::ConstString,std::pair<Clasp::ConstString_const,unsigned_int>,std::allocator<std::pair<Clasp::ConstString_const,unsigned_int>>,std::__detail::_Select1st,Clasp::StrEq,Clasp::StrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)((this->atoms_).ptr_ & 0xfffffffffffffffe);
  if (p_Var1 != (_Hashtable<Clasp::ConstString,std::pair<Clasp::ConstString_const,unsigned_int>,std::allocator<std::pair<Clasp::ConstString_const,unsigned_int>>,std::__detail::_Select1st,Clasp::StrEq,Clasp::StrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)0x0) {
    ConstString::ConstString(&local_30,&CStack_38);
    local_28 = id;
    std::
    _Hashtable<Clasp::ConstString,std::pair<Clasp::ConstString_const,unsigned_int>,std::allocator<std::pair<Clasp::ConstString_const,unsigned_int>>,std::__detail::_Select1st,Clasp::StrEq,Clasp::StrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<Clasp::ConstString_const,unsigned_int>>(p_Var1);
    ConstString::~ConstString(&local_30);
  }
  if (output) {
    Asp::LogicProgram::addOutput((this->super_LogicProgramAdapter).lp_,&CStack_38,id);
  }
  ConstString::~ConstString(&CStack_38);
  return;
}

Assistant:

void add(Potassco::Atom_t id, const Potassco::StringSpan& name, bool output) {
		ConstString n(name);
		if (atoms_.get()) { atoms_->insert(StrMap::value_type(n, id)); }
		if (output) { lp_->addOutput(n, id); }
	}